

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

void ts_subtree_balance(Subtree self,SubtreePool *pool,TSLanguage *language)

{
  MutableSubtreeArray *self_00;
  uint32_t *puVar1;
  TSSymbol TVar2;
  uint32_t uVar3;
  uint uVar4;
  SubtreeHeapData *pSVar5;
  Subtree *pSVar6;
  SubtreeHeapData *pSVar7;
  SubtreeHeapData *pSVar8;
  MutableSubtree self_01;
  MutableSubtree self_02;
  MutableSubtree self_03;
  SubtreeHeapData *pSVar9;
  uint uVar10;
  uint32_t i;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  
  self_00 = &pool->tree_stack;
  (pool->tree_stack).size = 0;
  if (((((ulong)self.ptr & 1) == 0) && ((self.ptr)->child_count != 0)) &&
     ((self.ptr)->ref_count == 1)) {
    array__grow((VoidArray *)self_00,8);
    uVar11 = (pool->tree_stack).size;
    (pool->tree_stack).size = uVar11 + 1;
    (pool->tree_stack).contents[uVar11] = (MutableSubtree)self;
  }
  do {
    uVar3 = (pool->tree_stack).size;
    if (uVar3 == 0) {
      return;
    }
    uVar11 = uVar3 - 1;
    uVar12 = (ulong)uVar11;
    (pool->tree_stack).size = uVar11;
    pSVar5 = (pool->tree_stack).contents[uVar12].ptr;
    if ((pSVar5->field_17).field_0.repeat_depth != 0) {
      pSVar6 = (pSVar5->field_17).field_0.children;
      pSVar9 = pSVar6->ptr;
      if (((((ulong)pSVar9 & 1) == 0) && (pSVar9->child_count != 0)) &&
         ((pSVar7 = pSVar6[pSVar5->child_count - 1].ptr, ((ulong)pSVar7 & 1) == 0 &&
          ((pSVar7->child_count != 0 &&
           (uVar11 = (pSVar9->field_17).field_0.repeat_depth,
           puVar1 = &(pSVar7->field_17).field_0.repeat_depth, uVar10 = uVar11 - *puVar1,
           *puVar1 <= uVar11 && uVar10 != 0)))))) {
        while (1 < uVar10) {
          uVar10 = uVar10 >> 1;
          TVar2 = pSVar5->symbol;
          pSVar9 = pSVar5;
          uVar11 = uVar10;
          while (((bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13 && (pSVar9->ref_count < 2)) &&
                 (1 < pSVar9->child_count))) {
            pSVar7 = (SubtreeHeapData *)**(ulong **)&pSVar9->field_17;
            if ((((((ulong)pSVar7 & 1) != 0) || (pSVar7->child_count < 2)) ||
                (((1 < pSVar7->ref_count ||
                  ((pSVar7->symbol != TVar2 ||
                   (pSVar8 = (SubtreeHeapData *)**(ulong **)&pSVar7->field_17,
                   ((ulong)pSVar8 & 1) != 0)))) || (pSVar8->child_count < 2)))) ||
               ((1 < pSVar8->ref_count || (pSVar8->symbol != TVar2)))) break;
            **(ulong **)&pSVar9->field_17 = (ulong)pSVar8;
            *(pSVar7->field_17).field_0.children =
                 (pSVar8->field_17).field_0.children[pSVar8->child_count - 1];
            (pSVar8->field_17).field_0.children[pSVar8->child_count - 1].ptr = pSVar7;
            array__grow((VoidArray *)self_00,8);
            uVar4 = (pool->tree_stack).size;
            (pool->tree_stack).size = uVar4 + 1;
            (pool->tree_stack).contents[uVar4].ptr = pSVar9;
            pSVar9 = pSVar8;
          }
          while (uVar11 = (pool->tree_stack).size, (uint)uVar12 < uVar11) {
            (pool->tree_stack).size = uVar11 - 1;
            self_01 = (MutableSubtree)(pool->tree_stack).contents[uVar11 - 1].ptr;
            self_02 = (MutableSubtree)(((self_01.ptr)->field_17).field_0.children)->ptr;
            self_03 = (MutableSubtree)
                      ((self_02.ptr)->field_17).field_0.children[(self_02.ptr)->child_count - 1].ptr
            ;
            ts_subtree_set_children
                      (self_03,((self_03.ptr)->field_17).field_0.children,(self_03.ptr)->child_count
                       ,language);
            ts_subtree_set_children
                      (self_02,((self_02.ptr)->field_17).field_0.children,(self_02.ptr)->child_count
                       ,language);
            ts_subtree_set_children
                      (self_01,((self_01.ptr)->field_17).field_0.children,(self_01.ptr)->child_count
                       ,language);
          }
          uVar12 = (ulong)uVar11;
        }
      }
    }
    for (uVar12 = 0; uVar12 < pSVar5->child_count; uVar12 = uVar12 + 1) {
      pSVar9 = (pSVar5->field_17).field_0.children[uVar12].ptr;
      if (((((ulong)pSVar9 & 1) == 0) && (pSVar9->child_count != 0)) && (pSVar9->ref_count == 1)) {
        array__grow((VoidArray *)self_00,8);
        uVar11 = (pool->tree_stack).size;
        (pool->tree_stack).size = uVar11 + 1;
        (pool->tree_stack).contents[uVar11].ptr = pSVar9;
      }
    }
  } while( true );
}

Assistant:

void ts_subtree_balance(Subtree self, SubtreePool *pool, const TSLanguage *language) {
  array_clear(&pool->tree_stack);

  if (ts_subtree_child_count(self) > 0 && self.ptr->ref_count == 1) {
    array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(self));
  }

  while (pool->tree_stack.size > 0) {
    MutableSubtree tree = array_pop(&pool->tree_stack);

    if (tree.ptr->repeat_depth > 0) {
      Subtree child1 = tree.ptr->children[0];
      Subtree child2 = tree.ptr->children[tree.ptr->child_count - 1];
      if (
        ts_subtree_child_count(child1) > 0 &&
        ts_subtree_child_count(child2) > 0 &&
        child1.ptr->repeat_depth > child2.ptr->repeat_depth
      ) {
        unsigned n = child1.ptr->repeat_depth - child2.ptr->repeat_depth;
        for (unsigned i = n / 2; i > 0; i /= 2) {
          ts_subtree__compress(tree, i, language, &pool->tree_stack);
          n -= i;
        }
      }
    }

    for (uint32_t i = 0; i < tree.ptr->child_count; i++) {
      Subtree child = tree.ptr->children[i];
      if (ts_subtree_child_count(child) > 0 && child.ptr->ref_count == 1) {
        array_push(&pool->tree_stack, ts_subtree_to_mut_unsafe(child));
      }
    }
  }
}